

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O3

void __thiscall
duckdb::KeyValueSecretReader::ThrowNotFoundError(KeyValueSecretReader *this,string *secret_key)

{
  pointer pcVar1;
  KeyValueSecret *pKVar2;
  InvalidConfigurationException *pIVar3;
  long *plVar4;
  long *plVar5;
  string secret_scope;
  string secret_scope_hint_message;
  string base_message;
  string local_130;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = local_c0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Failed to fetch required secret key \'%s\' from secret","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  if ((this->secret).ptr == (KeyValueSecret *)0x0) {
    pcVar1 = (this->path)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,pcVar1 + (this->path)._M_string_length);
    if (local_110._M_string_length == 0) {
      local_f0 = &local_e0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,".","");
    }
    else {
      ::std::operator+(&local_130," for \'",&local_110);
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_130);
      local_f0 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_f0 == plVar5) {
        local_e0 = *plVar5;
        lStack_d8 = plVar4[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar5;
      }
      local_e8 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
    }
    pIVar3 = (InvalidConfigurationException *)__cxa_allocate_exception(0x10);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_d0,local_d0 + local_c8);
    ::std::__cxx11::string::append((char *)&local_130);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar1 = (secret_key->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + secret_key->_M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_f0,local_e8 + (long)local_f0);
    InvalidConfigurationException::
    InvalidConfigurationException<std::__cxx11::string,std::__cxx11::string>
              (pIVar3,&local_130,&local_70,&local_90);
    __cxa_throw(pIVar3,&InvalidConfigurationException::typeinfo,::std::runtime_error::~runtime_error
               );
  }
  pIVar3 = (InvalidConfigurationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_d0,local_d0 + local_c8);
  ::std::__cxx11::string::append((char *)&local_110);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (secret_key->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + secret_key->_M_string_length);
  optional_ptr<const_duckdb::KeyValueSecret,_true>::CheckValid(&this->secret);
  pKVar2 = (this->secret).ptr;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (pKVar2->super_BaseSecret).name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (pKVar2->super_BaseSecret).name._M_string_length);
  InvalidConfigurationException::
  InvalidConfigurationException<std::__cxx11::string,std::__cxx11::string>
            (pIVar3,&local_110,&local_50,&local_b0);
  __cxa_throw(pIVar3,&InvalidConfigurationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void KeyValueSecretReader::ThrowNotFoundError(const string &secret_key) {
	string base_message = "Failed to fetch required secret key '%s' from secret";

	if (!secret) {
		string secret_scope = path;
		string secret_scope_hint_message = secret_scope.empty() ? "." : " for '" + secret_scope + "'.";
		throw InvalidConfigurationException(base_message + ", because no secret was found%s", secret_key,
		                                    secret_scope_hint_message);
	}

	throw InvalidConfigurationException(base_message + " '%s'.", secret_key, secret->GetName());
}